

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

slist * gen_load_a(compiler_state_t *cstate,e_offrel offrel,u_int offset,u_int size)

{
  slist *s1;
  slist *s2;
  slist *s;
  u_int size_local;
  u_int offset_local;
  e_offrel offrel_local;
  compiler_state_t *cstate_local;
  
  switch(offrel) {
  case OR_PACKET:
    s2 = new_stmt(cstate,size | 0x20);
    (s2->s).k = offset;
    break;
  case OR_LINKHDR:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,offset,size);
    break;
  case OR_PREVLINKHDR:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_prevlinkhdr,offset,size);
    break;
  case OR_LLC:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,offset,size);
    break;
  case OR_PREVMPLSHDR:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,(cstate->off_nl - 4) + offset,size);
    break;
  case OR_LINKTYPE:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,offset,size);
    break;
  case OR_LINKPL:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,cstate->off_nl + offset,size);
    break;
  case OR_LINKPL_NOSNAP:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,cstate->off_nl_nosnap + offset,size);
    break;
  case OR_TRAN_IPV4:
    s2 = gen_loadx_iphdrlen(cstate);
    s1 = new_stmt(cstate,size | 0x40);
    (s1->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + offset;
    sappend(s2,s1);
    break;
  case OR_TRAN_IPV6:
    s2 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,cstate->off_nl + 0x28 + offset,size);
    break;
  default:
    abort();
  }
  return s2;
}

Assistant:

static struct slist *
gen_load_a(compiler_state_t *cstate, enum e_offrel offrel, u_int offset,
    u_int size)
{
	struct slist *s, *s2;

	switch (offrel) {

	case OR_PACKET:
                s = new_stmt(cstate, BPF_LD|BPF_ABS|size);
                s->s.k = offset;
		break;

	case OR_LINKHDR:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linkhdr, offset, size);
		break;

	case OR_PREVLINKHDR:
		s = gen_load_absoffsetrel(cstate, &cstate->off_prevlinkhdr, offset, size);
		break;

	case OR_LLC:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linkpl, offset, size);
		break;

	case OR_PREVMPLSHDR:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linkpl, cstate->off_nl - 4 + offset, size);
		break;

	case OR_LINKPL:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linkpl, cstate->off_nl + offset, size);
		break;

	case OR_LINKPL_NOSNAP:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linkpl, cstate->off_nl_nosnap + offset, size);
		break;

	case OR_LINKTYPE:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linktype, offset, size);
		break;

	case OR_TRAN_IPV4:
		/*
		 * Load the X register with the length of the IPv4 header
		 * (plus the offset of the link-layer header, if it's
		 * preceded by a variable-length header such as a radio
		 * header), in bytes.
		 */
		s = gen_loadx_iphdrlen(cstate);

		/*
		 * Load the item at {offset of the link-layer payload} +
		 * {offset, relative to the start of the link-layer
		 * paylod, of the IPv4 header} + {length of the IPv4 header} +
		 * {specified offset}.
		 *
		 * If the offset of the link-layer payload is variable,
		 * the variable part of that offset is included in the
		 * value in the X register, and we include the constant
		 * part in the offset of the load.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_IND|size);
		s2->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + offset;
		sappend(s, s2);
		break;

	case OR_TRAN_IPV6:
		s = gen_load_absoffsetrel(cstate, &cstate->off_linkpl, cstate->off_nl + 40 + offset, size);
		break;

	default:
		abort();
		return NULL;
	}
	return s;
}